

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::solveUpdateLeft(CLUFactor<double> *this,double *vec)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  StableSum<double> tmp;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  double *val;
  double *lval;
  int end;
  int k;
  int j;
  int i;
  StableSum<double> local_60;
  long local_50;
  int *local_48;
  long local_40;
  long local_38;
  double *local_30;
  double *local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  local_28 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x298364);
  local_40 = *(long *)(in_RDI + 0x78);
  local_38 = *(long *)(in_RDI + 0x98);
  local_50 = *(long *)(in_RDI + 0x90);
  local_20 = *(int *)(in_RDI + 0x84);
  local_14 = *(int *)(in_RDI + 0x88);
  while (local_14 = local_14 + -1, local_20 <= local_14) {
    local_1c = *(int *)(local_50 + (long)local_14 * 4);
    local_30 = local_28 + local_1c;
    local_48 = (int *)(local_40 + (long)local_1c * 4);
    StableSum<double>::StableSum
              (&local_60,-*(double *)(local_10 + (long)*(int *)(local_38 + (long)local_14 * 4) * 8))
    ;
    for (local_18 = *(int *)(local_50 + (long)(local_14 + 1) * 4); local_1c < local_18;
        local_18 = local_18 + -1) {
      iVar1 = *local_48;
      dVar2 = *local_30;
      local_48 = local_48 + 1;
      local_30 = local_30 + 1;
      StableSum<double>::operator+=(&local_60,*(double *)(local_10 + (long)iVar1 * 8) * dVar2);
    }
    dVar2 = StableSum::operator_cast_to_double((StableSum *)&local_60);
    *(double *)(local_10 + (long)*(int *)(local_38 + (long)local_14 * 4) * 8) = -dVar2;
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUpdateLeft(R* vec)
{
   int i, j, k, end;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   assert(!l.updateType);               /* Forest-Tomlin Updates */

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      StableSum<R> tmp(-vec[lrow[i]]);

      for(j = lbeg[i + 1]; j > k; --j)
         tmp += vec[*idx++] * (*val++);

      vec[lrow[i]] = -R(tmp);
   }
}